

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

int __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::TryParseExtendedUnicodeEscape
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,Char *c,
          bool *previousSurrogatePart,bool trackSurrogatePair)

{
  StandardChars<char16_t> *pSVar1;
  code *pcVar2;
  bool bVar3;
  EncodedChar EVar4;
  Char CVar5;
  uint uVar6;
  ScriptConfiguration *pSVar7;
  undefined4 *puVar8;
  bool local_59;
  char16 local_3a;
  uint local_38;
  CharCount CStack_34;
  char16 other;
  uint consumptionNumber;
  int i;
  codepoint_t codePoint;
  bool trackSurrogatePair_local;
  bool *previousSurrogatePart_local;
  Char *c_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this_local;
  
  i._3_1_ = trackSurrogatePair;
  _codePoint = previousSurrogatePart;
  previousSurrogatePart_local = (bool *)c;
  c_local = (Char *)this;
  pSVar7 = Js::ScriptContext::GetConfig(this->scriptContext);
  bVar3 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(pSVar7);
  if (((bVar3) && (bVar3 = ECCanConsume(this,2), bVar3)) &&
     (EVar4 = ECLookahead(this,0), EVar4 == L'{')) {
    pSVar1 = this->standardEncodedChars;
    EVar4 = ECLookahead(this,1);
    bVar3 = StandardChars<char16_t>::IsHex(pSVar1,EVar4);
    if (bVar3) {
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,1);
      consumptionNumber = StandardChars<char16_t>::DigitValue(pSVar1,EVar4);
      CStack_34 = 2;
      while( true ) {
        bVar3 = ECCanConsume(this,CStack_34 + 1);
        local_59 = false;
        if (bVar3) {
          pSVar1 = this->standardEncodedChars;
          EVar4 = ECLookahead(this,CStack_34);
          local_59 = StandardChars<char16_t>::IsHex(pSVar1,EVar4);
        }
        if (local_59 == false) break;
        consumptionNumber = consumptionNumber << 4;
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,CStack_34);
        uVar6 = StandardChars<char16_t>::DigitValue(pSVar1,EVar4);
        consumptionNumber = uVar6 + consumptionNumber;
        if (0x10ffff < consumptionNumber) {
          DeferredFailIfUnicode(this,-0x7ff5e9d6);
          return 0;
        }
        CStack_34 = CStack_34 + 1;
      }
      bVar3 = ECCanConsume(this,CStack_34 + 1);
      if ((bVar3) && (EVar4 = ECLookahead(this,CStack_34), EVar4 == L'}')) {
        local_38 = CStack_34 + 1;
        if (local_38 < 3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x111,"(consumptionNumber >= 3)","consumptionNumber >= 3");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (((*_codePoint & 1U) == 0) && ((i._3_1_ & 1) != 0)) {
          pSVar7 = Js::ScriptContext::GetConfig(this->scriptContext);
          bVar3 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(pSVar7);
          if (bVar3) {
            TrackIfSurrogatePair(this,consumptionNumber,this->next + -1,local_38 + 1);
          }
        }
        if (consumptionNumber < 0x10000) {
          CVar5 = Chars<char16_t>::UTC(consumptionNumber);
          *(Char *)previousSurrogatePart_local = CVar5;
          ECConsumeMultiUnit(this,local_38);
        }
        else if ((*_codePoint & 1U) == 0) {
          *_codePoint = true;
          Js::NumberUtilities::CodePointAsSurrogatePair
                    (consumptionNumber,(char16 *)previousSurrogatePart_local,&local_3a);
          EVar4 = ECLookback(this,1);
          if ((EVar4 != L'u') || (EVar4 = ECLookback(this,2), EVar4 != L'\\')) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,300,"(ECLookback(1) == \'u\' && ECLookback(2) == \'\\\\\')",
                               "ECLookback(1) == \'u\' && ECLookback(2) == \'\\\\\'");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          ECRevert(this,2);
        }
        else {
          *_codePoint = false;
          Js::NumberUtilities::CodePointAsSurrogatePair
                    (consumptionNumber,&local_3a,(char16 *)previousSurrogatePart_local);
          ECConsumeMultiUnit(this,local_38);
        }
        return local_38;
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

int Parser<P, IsLiteral>::TryParseExtendedUnicodeEscape(Char& c, bool& previousSurrogatePart, bool trackSurrogatePair /* = false */)
    {
        if (!scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
        {
            return 0;
        }

        if (!ECCanConsume(2) || ECLookahead(0) !='{' || !standardEncodedChars->IsHex(ECLookahead(1)))
        {
            return 0;
        }

        // The first character is mandatory to consume escape sequence, so we check for it above, at this stage we can set it as we already checked.
        codepoint_t codePoint = standardEncodedChars->DigitValue(ECLookahead(1));

        int i = 2;

        while(ECCanConsume(i + 1) && standardEncodedChars->IsHex(ECLookahead(i)))
        {
            codePoint <<= 4;
            codePoint += standardEncodedChars->DigitValue(ECLookahead(i));

            if (codePoint > 0x10FFFF)
            {
                DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
                return 0;
            }
            i++;
        }

        if(!ECCanConsume(i + 1) || ECLookahead(i) != '}')
        {
            return 0;
        }

        uint consumptionNumber = i + 1;
        Assert(consumptionNumber >= 3);

        if (!previousSurrogatePart && trackSurrogatePair && this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
        {
            // Current location
            TrackIfSurrogatePair(codePoint, (next - 1), consumptionNumber + 1);
        }

        char16 other;
        // Generally if this code point is a single character, then we take it and return.
        // If the character is made up of two characters then we emit the first and backtrack to the start of th escape sequence;
        // Following that we check if we have already seen the first character, and if so emit the second and consume the entire escape sequence.
        if (codePoint < 0x10000)
        {
            c = UTC(codePoint);
            ECConsumeMultiUnit(consumptionNumber);
        }
        else if (previousSurrogatePart)
        {
            previousSurrogatePart = false;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &other, &c);
            ECConsumeMultiUnit(consumptionNumber);
        }
        else
        {
            previousSurrogatePart = true;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &c, &other);
            Assert(ECLookback(1) == 'u' && ECLookback(2) == '\\');
            ECRevert(2);
        }

        return consumptionNumber;
    }